

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.h
# Opt level: O3

void __thiscall
TPZBlockDiagonal<double>::CopyFrom(TPZBlockDiagonal<double> *this,TPZMatrix<double> *mat)

{
  TPZMatrix<double> *cp;
  
  if (mat != (TPZMatrix<double> *)0x0) {
    cp = (TPZMatrix<double> *)__dynamic_cast(mat,&TPZMatrix<double>::typeinfo,&typeinfo,0);
    if (cp != (TPZMatrix<double> *)0x0) {
      TPZMatrix<double>::operator=(&this->super_TPZMatrix<double>,cp);
      TPZVec<double>::operator=(&this->fStorage,(TPZVec<double> *)(cp + 1));
      TPZVec<long>::operator=(&this->fBlockPos,(TPZVec<long> *)(cp + 2));
      TPZVec<int>::operator=(&this->fBlockSize,(TPZVec<int> *)(cp + 3));
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZBlockDiagonal<double>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double]"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.h"
             ,0x38);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZBlockDiagonal<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }